

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void minMaxFinalize(sqlite3_context *context)

{
  sqlite3_context *pCtx;
  sqlite3_value *pRes;
  sqlite3_value *in_stack_ffffffffffffffe8;
  
  pCtx = (sqlite3_context *)
         sqlite3_aggregate_context((sqlite3_context *)in_stack_ffffffffffffffe8,0);
  if (pCtx != (sqlite3_context *)0x0) {
    if (*(short *)&pCtx->pFunc != 0) {
      sqlite3_result_value(pCtx,in_stack_ffffffffffffffe8);
    }
    sqlite3VdbeMemRelease((Mem *)0x1aab37);
  }
  return;
}

Assistant:

static void minMaxFinalize(sqlite3_context *context){
  sqlite3_value *pRes;
  pRes = (sqlite3_value *)sqlite3_aggregate_context(context, 0);
  if( pRes ){
    if( pRes->flags ){
      sqlite3_result_value(context, pRes);
    }
    sqlite3VdbeMemRelease(pRes);
  }
}